

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prop_down.h
# Opt level: O0

void __thiscall
mp::
ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::PropagateResult<mp::QuadAndLinTerms,0>
          (ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>
                 *con,double lb,double ub,Context ctx)

{
  int iVar1;
  CtxVal v;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_> *in_RSI;
  undefined8 in_RDI;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> *in_XMM0_Qa;
  double unaff_retaddr;
  double in_stack_00000008;
  int in_stack_00000014;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_00000018;
  Context in_stack_00000024;
  Context local_30;
  Context local_2c;
  double local_28;
  Context ctx_00;
  
  ctx_00.value_ = (CtxVal)((ulong)in_RDI >> 0x20);
  internal::Unused<double,double>((double *)&stack0xffffffffffffffe0,&local_28);
  IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>::
  get_binary_var(in_RSI);
  BasicFlatConverter::MinusInfty();
  BasicFlatConverter::Infty();
  iVar1 = IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>::
          get_binary_value(in_RSI);
  v = CTX_POS;
  if (iVar1 == 1) {
    v = CTX_NEG;
  }
  Context::Context(&local_2c,v);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr
            (in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,in_stack_00000024);
  IndicatorConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>_>::
  get_constraint(in_RSI);
  Context::Context(&local_30,CTX_POS);
  PropagateResult<mp::QuadAndLinTerms,mp::AlgConRhs<0>>
            ((ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
              *)in_RSI,in_XMM0_Qa,ctx_00);
  return;
}

Assistant:

void PropagateResult(IndicatorConstraint<
                         AlgebraicConstraint< Body, AlgConRhs<sens> > >& con,
                       double lb, double ub, Context ctx) {
    internal::Unused(lb, ub);
    MPD( PropagateResultOfInitExpr(con.get_binary_var(),
                              MPD( MinusInfty() ), MPD( Infty() ),
                              1==con.get_binary_value() ?  // b==1 means b in CTX_NEG
                                Context::CTX_NEG : Context::CTX_POS) );
    PropagateResult(con.get_constraint(), Context::CTX_POS);      // implication
  }